

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

_Bool ecs_query_next_worker(ecs_iter_t *it,int32_t current,int32_t total)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  byte bVar5;
  int iVar6;
  byte unaff_R15B;
  byte bVar7;
  
  iVar1 = it->offset;
  do {
    _Var3 = ecs_query_next(it);
    if (!_Var3) {
      bVar7 = 0;
      goto LAB_0011af7c;
    }
    iVar2 = it->count;
    iVar4 = iVar2 / total;
    iVar6 = iVar4 * current;
    if (iVar2 != iVar4 * total) {
      if (current < iVar2 % total) {
        iVar4 = iVar4 + 1;
        iVar6 = iVar6 + current;
      }
      else {
        iVar6 = iVar6 + iVar2 % total;
      }
    }
    bVar5 = 1;
    bVar7 = unaff_R15B;
    if (iVar4 == 0) {
      bVar5 = (byte)it->query->flags;
      bVar7 = current == 0;
      if ((bVar5 & 1) != 0) {
        bVar7 = unaff_R15B;
      }
    }
    if ((bVar5 & 1) == 0) goto LAB_0011af7c;
    unaff_R15B = bVar7;
  } while (iVar4 == 0);
  it->count = iVar4;
  it->offset = it->offset + iVar6;
  it->entities = it->entities + iVar6;
  it->frame_offset = iVar6 + (it->frame_offset - iVar1);
  bVar7 = 1;
LAB_0011af7c:
  return (_Bool)(bVar7 & 1);
}

Assistant:

bool ecs_query_next_worker(
    ecs_iter_t *it,
    int32_t current,
    int32_t total)
{
    int32_t per_worker, first, prev_offset = it->offset;

    do {
        if (!ecs_query_next(it)) {
            return false;
        }

        int32_t count = it->count;
        per_worker = count / total;
        first = per_worker * current;

        count -= per_worker * total;

        if (count) {
            if (current < count) {
                per_worker ++;
                first += current;
            } else {
                first += count;
            }
        }

        if (!per_worker && !(it->query->flags & EcsQueryNeedsTables)) {
            if (current == 0) {
                return true;
            } else {
                return false;
            }
        }
    } while (!per_worker);

    it->frame_offset -= prev_offset;
    it->count = per_worker;
    it->offset += first;
    it->entities = &it->entities[first];
    it->frame_offset += first;

    return true;
}